

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::compressedtexsubimage2d_neg_level
               (NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int faceIterTcu;
  uint uVar2;
  GLenum GVar3;
  GLenum *pGVar4;
  string local_48;
  deUint32 textures [2];
  
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,textures);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,textures[0]);
  uVar2 = 0;
  glu::CallLogWrapper::glCompressedTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x9278,0x12,0x12,0,400,(void *)0x0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8513,textures[1]);
  pGVar4 = &DAT_01cb8e20;
  do {
    GVar3 = 0;
    if (uVar2 < 6) {
      GVar3 = *pGVar4;
    }
    glu::CallLogWrapper::glCompressedTexImage2D
              (&ctx->super_CallLogWrapper,GVar3,0,0x9278,0x12,0x12,0,400,(void *)0x0);
    uVar2 = uVar2 + 1;
    pGVar4 = pGVar4 + 1;
  } while (uVar2 != 6);
  NegativeTestContext::expectError(ctx,0);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"GL_INVALID_VALUE is generated if level is less than 0.","");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,-1,0,0,0,0,0x9278,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"GL_INVALID_VALUE is generated if level is less than 0.","");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pGVar4 = &DAT_01cb8e20;
  uVar2 = 0;
  do {
    GVar3 = 0;
    if (uVar2 < 6) {
      GVar3 = *pGVar4;
    }
    glu::CallLogWrapper::glCompressedTexSubImage2D
              (&ctx->super_CallLogWrapper,GVar3,-1,0,0,0,0,0x9278,0,(void *)0x0);
    NegativeTestContext::expectError(ctx,0x501);
    uVar2 = uVar2 + 1;
    pGVar4 = pGVar4 + 1;
  } while (uVar2 != 6);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,2,textures);
  return;
}

Assistant:

void compressedtexsubimage2d_neg_level (NegativeTestContext& ctx)
{
	deUint32				textures[2];
	ctx.glGenTextures			(2, &textures[0]);
	ctx.glBindTexture			(GL_TEXTURE_2D, textures[0]);
	ctx.glCompressedTexImage2D	(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 18, 18, 0, etc2EacDataSize(18, 18), 0);
	ctx.glBindTexture			(GL_TEXTURE_CUBE_MAP, textures[1]);
	FOR_CUBE_FACES(faceGL, ctx.glCompressedTexImage2D(faceGL, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 18, 18, 0, etc2EacDataSize(18, 18), 0););
	ctx.expectError				(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated if level is less than 0.");
	ctx.glCompressedTexSubImage2D(GL_TEXTURE_2D, -1, 0, 0, 0, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if level is less than 0.");
	FOR_CUBE_FACES(faceGL,
	{
		ctx.glCompressedTexSubImage2D(faceGL, -1, 0, 0, 0, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0);
		ctx.expectError(GL_INVALID_VALUE);
	});
	ctx.endSection();

	ctx.glDeleteTextures(2, &textures[0]);
}